

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPub.c
# Opt level: O2

void sbfPubRemoveEventCb(int fd,short events,void *closure)

{
  int *piVar1;
  long lVar2;
  long *__ptr;
  undefined8 *__ptr_00;
  undefined8 uVar3;
  long *plVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  long *plVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  
  lVar2 = *(long *)((long)closure + 0x18);
  if (*(int *)((long)closure + 0x14) == 0) {
    *(undefined4 *)((long)closure + 0xc) = 1;
    uVar3 = *(undefined8 *)(lVar2 + 8);
    pcVar9 = sbfTopic_getTopic(*closure);
    sbfLog_log(uVar3,0,"not removing publisher %p (%s); not ready",closure,pcVar9);
    return;
  }
  __ptr = *(long **)((long)closure + 0x20);
  __ptr_00 = *(undefined8 **)((long)closure + 0x28);
  uVar3 = *(undefined8 *)(lVar2 + 8);
  pcVar9 = sbfTopic_getTopic(*closure);
  sbfLog_log(uVar3,0,"removing publisher %p (%s) (stream %p)",closure,pcVar9,__ptr);
  lVar10 = *(long *)((long)closure + 0x158);
  plVar4 = *(long **)((long)closure + 0x160);
  puVar11 = (undefined8 *)(lVar10 + 0x160);
  if (lVar10 == 0) {
    puVar11 = __ptr_00 + 2;
  }
  *puVar11 = plVar4;
  *plVar4 = lVar10;
  if (__ptr_00[1] != 0) goto LAB_00103e68;
  sbfLog_log(*(undefined8 *)(*__ptr + 8),0,"removing topic %p",__ptr_00);
  LOCK();
  plVar4 = __ptr + 3;
  *(int *)plVar4 = (int)*plVar4 + -1;
  lVar7 = *plVar4;
  UNLOCK();
  plVar4 = __ptr + 4;
  lVar10 = __ptr_00[0xb];
  if (__ptr_00[10] == 0) {
    lVar12 = __ptr_00[0xc];
    iVar15 = *(int *)(__ptr_00 + 0xd);
    if (lVar10 != 0) goto LAB_00103ac1;
    lVar10 = 0;
LAB_00103acd:
    plVar14 = plVar4;
    if (lVar12 != 0) {
      plVar14 = (long *)(lVar12 + 0x58);
      if (*(undefined8 **)(lVar12 + 0x50) == __ptr_00) {
        plVar14 = (long *)(lVar12 + 0x50);
      }
    }
    *plVar14 = lVar10;
  }
  else {
    if (lVar10 == 0) {
      lVar12 = __ptr_00[0xc];
      iVar15 = *(int *)(__ptr_00 + 0xd);
      lVar10 = __ptr_00[10];
LAB_00103ac1:
      *(long *)(lVar10 + 0x60) = lVar12;
      goto LAB_00103acd;
    }
    do {
      lVar16 = lVar10;
      lVar10 = *(long *)(lVar16 + 0x50);
    } while (*(long *)(lVar16 + 0x50) != 0);
    lVar10 = *(long *)(lVar16 + 0x58);
    lVar12 = *(long *)(lVar16 + 0x60);
    iVar15 = *(int *)(lVar16 + 0x68);
    if (lVar10 != 0) {
      *(long *)(lVar10 + 0x60) = lVar12;
    }
    plVar14 = plVar4;
    if (lVar12 != 0) {
      plVar14 = (long *)(lVar12 + 0x58);
      if (*(long *)(lVar12 + 0x50) == lVar16) {
        plVar14 = (long *)(lVar12 + 0x50);
      }
    }
    *plVar14 = lVar10;
    if (*(undefined8 **)(lVar16 + 0x60) == __ptr_00) {
      lVar12 = lVar16;
    }
    uVar3 = __ptr_00[10];
    uVar5 = __ptr_00[0xb];
    uVar6 = __ptr_00[0xd];
    *(undefined8 *)(lVar16 + 0x60) = __ptr_00[0xc];
    *(undefined8 *)(lVar16 + 0x68) = uVar6;
    *(undefined8 *)(lVar16 + 0x50) = uVar3;
    *(undefined8 *)(lVar16 + 0x58) = uVar5;
    lVar17 = __ptr_00[0xc];
    plVar14 = plVar4;
    if (lVar17 != 0) {
      plVar14 = (long *)(lVar17 + 0x58);
      if (*(undefined8 **)(lVar17 + 0x50) == __ptr_00) {
        plVar14 = (long *)(lVar17 + 0x50);
      }
    }
    *plVar14 = lVar16;
    *(long *)(__ptr_00[10] + 0x60) = lVar16;
    if (__ptr_00[0xb] != 0) {
      *(long *)(__ptr_00[0xb] + 0x60) = lVar16;
    }
    lVar16 = lVar12;
    if (lVar12 == 0) {
      lVar12 = 0;
    }
    else {
      do {
        plVar14 = (long *)(lVar16 + 0x60);
        lVar16 = *plVar14;
      } while (*plVar14 != 0);
    }
  }
  if (iVar15 == 0) {
    while( true ) {
      if ((lVar10 != 0) && (*(int *)(lVar10 + 0x68) != 0)) goto LAB_00103dba;
      lVar16 = *plVar4;
      if (lVar10 == lVar16) goto LAB_00103db5;
      lVar17 = *(long *)(lVar12 + 0x50);
      if (lVar17 == lVar10) {
        lVar10 = *(long *)(lVar12 + 0x58);
        lVar13 = lVar10;
        if (*(int *)(lVar10 + 0x68) == 1) {
          *(undefined4 *)(lVar10 + 0x68) = 0;
          *(undefined4 *)(lVar12 + 0x68) = 1;
          lVar13 = *(long *)(lVar10 + 0x50);
          *(long *)(lVar12 + 0x58) = lVar13;
          if (lVar13 != 0) {
            *(long *)(lVar13 + 0x60) = lVar12;
          }
          lVar17 = *(long *)(lVar12 + 0x60);
          *(long *)(lVar10 + 0x60) = lVar17;
          if (lVar17 == 0) {
            *plVar4 = lVar10;
            lVar16 = lVar10;
          }
          else if (lVar12 == *(long *)(lVar17 + 0x50)) {
            *(long *)(lVar17 + 0x50) = lVar10;
          }
          else {
            *(long *)(lVar17 + 0x58) = lVar10;
            lVar13 = *(long *)(lVar12 + 0x58);
          }
          *(long *)(lVar10 + 0x50) = lVar12;
          *(long *)(lVar12 + 0x60) = lVar10;
        }
        lVar10 = *(long *)(lVar13 + 0x50);
        if ((lVar10 == 0) || (*(int *)(lVar10 + 0x68) == 0)) {
          lVar17 = *(long *)(lVar13 + 0x58);
          if ((lVar17 == 0) || (*(int *)(lVar17 + 0x68) == 0)) goto LAB_00103c04;
        }
        else {
          lVar17 = *(long *)(lVar13 + 0x58);
          if ((lVar17 == 0) || (*(int *)(lVar17 + 0x68) == 0)) {
            *(undefined4 *)(lVar10 + 0x68) = 0;
            *(undefined4 *)(lVar13 + 0x68) = 1;
            lVar17 = *(long *)(lVar10 + 0x58);
            *(long *)(lVar13 + 0x50) = lVar17;
            if (lVar17 != 0) {
              *(long *)(lVar17 + 0x60) = lVar13;
            }
            lVar17 = *(long *)(lVar13 + 0x60);
            *(long *)(lVar10 + 0x60) = lVar17;
            plVar14 = plVar4;
            lVar8 = lVar10;
            if (lVar17 != 0) {
              plVar14 = (long *)(lVar17 + 0x58);
              lVar8 = lVar16;
              if (lVar13 == *(long *)(lVar17 + 0x50)) {
                plVar14 = (long *)(lVar17 + 0x50);
              }
            }
            lVar16 = lVar8;
            *plVar14 = lVar10;
            *(long *)(lVar10 + 0x58) = lVar13;
            *(long *)(lVar13 + 0x60) = lVar10;
            lVar13 = *(long *)(lVar12 + 0x58);
            lVar17 = *(long *)(lVar13 + 0x58);
          }
        }
        *(undefined4 *)(lVar13 + 0x68) = *(undefined4 *)(lVar12 + 0x68);
        *(undefined4 *)(lVar12 + 0x68) = 0;
        if (lVar17 != 0) {
          *(undefined4 *)(lVar17 + 0x68) = 0;
        }
        lVar10 = *(long *)(lVar13 + 0x50);
        *(long *)(lVar12 + 0x58) = lVar10;
        if (lVar10 != 0) {
          *(long *)(lVar10 + 0x60) = lVar12;
        }
        lVar17 = *(long *)(lVar12 + 0x60);
        *(long *)(lVar13 + 0x60) = lVar17;
        lVar10 = lVar13;
        plVar14 = plVar4;
        if (lVar17 != 0) {
          lVar10 = lVar16;
          plVar14 = (long *)(lVar17 + 0x58);
          if (lVar12 == *(long *)(lVar17 + 0x50)) {
            plVar14 = (long *)(lVar17 + 0x50);
          }
        }
        *plVar14 = lVar13;
        *(long *)(lVar13 + 0x50) = lVar12;
        goto LAB_00103db1;
      }
      lVar13 = lVar17;
      if (*(int *)(lVar17 + 0x68) == 1) {
        *(undefined4 *)(lVar17 + 0x68) = 0;
        *(undefined4 *)(lVar12 + 0x68) = 1;
        lVar13 = *(long *)(lVar17 + 0x58);
        *(long *)(lVar12 + 0x50) = lVar13;
        if (lVar13 != 0) {
          *(long *)(lVar13 + 0x60) = lVar12;
        }
        lVar10 = *(long *)(lVar12 + 0x60);
        *(long *)(lVar17 + 0x60) = lVar10;
        if (lVar10 == 0) {
          *plVar4 = lVar17;
          lVar16 = lVar17;
        }
        else if (lVar12 == *(long *)(lVar10 + 0x50)) {
          *(long *)(lVar10 + 0x50) = lVar17;
          lVar13 = *(long *)(lVar12 + 0x50);
        }
        else {
          *(long *)(lVar10 + 0x58) = lVar17;
        }
        *(long *)(lVar17 + 0x58) = lVar12;
        *(long *)(lVar12 + 0x60) = lVar17;
      }
      lVar10 = *(long *)(lVar13 + 0x50);
      if ((lVar10 != 0) && (*(int *)(lVar10 + 0x68) != 0)) goto LAB_00103c9b;
      lVar17 = *(long *)(lVar13 + 0x58);
      if ((lVar17 != 0) && (*(int *)(lVar17 + 0x68) != 0)) break;
LAB_00103c04:
      *(undefined4 *)(lVar13 + 0x68) = 1;
      lVar10 = lVar12;
      lVar12 = *(long *)(lVar12 + 0x60);
    }
    if ((lVar10 == 0) || (*(int *)(lVar10 + 0x68) == 0)) {
      *(undefined4 *)(lVar17 + 0x68) = 0;
      *(undefined4 *)(lVar13 + 0x68) = 1;
      lVar10 = *(long *)(lVar17 + 0x50);
      *(long *)(lVar13 + 0x58) = lVar10;
      if (lVar10 != 0) {
        *(long *)(lVar10 + 0x60) = lVar13;
      }
      lVar10 = *(long *)(lVar13 + 0x60);
      *(long *)(lVar17 + 0x60) = lVar10;
      plVar14 = plVar4;
      lVar8 = lVar17;
      if (lVar10 != 0) {
        plVar14 = (long *)(lVar10 + 0x58);
        lVar8 = lVar16;
        if (lVar13 == *(long *)(lVar10 + 0x50)) {
          plVar14 = (long *)(lVar10 + 0x50);
        }
      }
      lVar16 = lVar8;
      *plVar14 = lVar17;
      *(long *)(lVar17 + 0x50) = lVar13;
      *(long *)(lVar13 + 0x60) = lVar17;
      lVar13 = *(long *)(lVar12 + 0x50);
      lVar10 = *(long *)(lVar13 + 0x50);
    }
LAB_00103c9b:
    *(undefined4 *)(lVar13 + 0x68) = *(undefined4 *)(lVar12 + 0x68);
    *(undefined4 *)(lVar12 + 0x68) = 0;
    if (lVar10 != 0) {
      *(undefined4 *)(lVar10 + 0x68) = 0;
    }
    lVar10 = *(long *)(lVar13 + 0x58);
    *(long *)(lVar12 + 0x50) = lVar10;
    if (lVar10 != 0) {
      *(long *)(lVar10 + 0x60) = lVar12;
    }
    lVar17 = *(long *)(lVar12 + 0x60);
    *(long *)(lVar13 + 0x60) = lVar17;
    lVar10 = lVar13;
    plVar14 = plVar4;
    if (lVar17 != 0) {
      lVar10 = lVar16;
      plVar14 = (long *)(lVar17 + 0x58);
      if (lVar12 == *(long *)(lVar17 + 0x50)) {
        plVar14 = (long *)(lVar17 + 0x50);
      }
    }
    *plVar14 = lVar13;
    *(long *)(lVar13 + 0x58) = lVar12;
LAB_00103db1:
    *(long *)(lVar12 + 0x60) = lVar13;
LAB_00103db5:
    if (lVar10 != 0) {
LAB_00103dba:
      *(undefined4 *)(lVar10 + 0x68) = 0;
    }
  }
  if ((int)lVar7 == 0) {
    if (*plVar4 != 0) {
      __assert_fail("!empty || ((&tstream->mTopics)->rbh_root == ((void*)0))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/blu-corner[P]sbf/src/transport/sbfTportPrivate.h"
                    ,0xc5,"int sbfTport_removeTopic(sbfTportStream, sbfTportTopic)");
    }
    free((void *)*__ptr_00);
    free(__ptr_00);
    pthread_mutex_lock((pthread_mutex_t *)(lVar2 + 0x180));
    if ((int)__ptr[3] == 0) {
      sbfLog_log(*(undefined8 *)(lVar2 + 8),0,"removing stream %p",__ptr);
      lVar10 = __ptr[10];
      plVar4 = (long *)__ptr[0xb];
      plVar14 = (long *)(lVar10 + 0x58);
      if (lVar10 == 0) {
        plVar14 = (long *)(lVar2 + 0x178);
      }
      *plVar14 = (long)plVar4;
      *plVar4 = lVar10;
      (**(code **)(*(long *)(lVar2 + 0x20) + 0x28))(__ptr[2]);
      pthread_mutex_destroy((pthread_mutex_t *)(__ptr + 5));
      free(__ptr);
    }
    pthread_mutex_unlock((pthread_mutex_t *)(lVar2 + 0x180));
  }
  else {
    free((void *)*__ptr_00);
    free(__ptr_00);
  }
LAB_00103e68:
  LOCK();
  piVar1 = (int *)((long)closure + 0x10);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 != 0) {
    return;
  }
  sbfPubFree((sbfPub)closure);
  return;
}

Assistant:

static void
sbfPubRemoveEventCb (int fd, short events, void* closure)
{
    sbfPub         pub0 = closure;
    sbfTport       tport = pub0->mTport;
    sbfTportStream tstream = pub0->mTportStream;
    sbfTportTopic  ttopic = pub0->mTportTopic;

    /*
     * If the pub is waiting for the stream to be added, the remove event could
     * be fired before it is ready. If so, defer the remove until the add
     * stream complete callback. The flag is set so the later callback knows
     * this callback has already fired and isn't queued behind it.
     */
    if (!pub0->mReady)
    {
        pub0->mRemoved = 1;
        sbfLog_debug (tport->mLog,
                      "not removing publisher %p (%s); not ready",
                      pub0,
                      sbfTopic_getTopic (pub0->mTopic));
        return;
    }

    sbfLog_debug (tport->mLog,
                  "removing publisher %p (%s) (stream %p)",
                  pub0,
                  sbfTopic_getTopic (pub0->mTopic),
                  tstream);

    TAILQ_REMOVE (&ttopic->mPubs, pub0, mEntry);
    if (TAILQ_EMPTY (&ttopic->mPubs) && sbfTport_removeTopic (tstream, ttopic))
    {
        sbfMutex_lock (&tport->mStreamsLock);
        /*
         * Reference count could be bumped between removeTopic (outside the
         * lock) and here.
         */
        if (sbfRefCount_get (&tstream->mRefCount) == 0)
            sbfTport_removeStream (tport, tstream);
        sbfMutex_unlock (&tport->mStreamsLock);
    }

    if (sbfRefCount_decrement (&pub0->mRefCount))
        sbfPubFree (pub0);
}